

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  mode_t mVar6;
  uint uVar7;
  mtree_entry *pmVar8;
  int *piVar9;
  la_int64_t lVar10;
  char *pcVar11;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar12;
  archive_string *paVar13;
  mtree_entry **ppmVar14;
  long lVar15;
  size_t sVar16;
  archive_rb_node *paVar17;
  archive_rb_node *paVar18;
  size_t len;
  char *pcVar19;
  size_t sVar20;
  char *pcVar21;
  timespec *ptVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  stat *__buf;
  byte *pbVar26;
  long lVar27;
  undefined1 *puVar28;
  mtree *mtree;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_130;
  archive_read *local_128;
  archive_string *local_120;
  mtree_entry *local_118;
  uint local_10c;
  mtree_entry *local_108;
  mtree_entry *local_100;
  archive_rb_tree *local_f8;
  char *local_f0;
  long local_e8;
  archive_entry *local_e0;
  mtree_entry **local_d8;
  mtree *local_d0;
  archive_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  local_128 = a;
  local_c8 = entry;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_d8 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_130 = (archive_entry *)0x0;
    detect_form(local_128,(int *)&local_e0);
    local_f8 = &mtree->rbtree;
    local_e8 = 1;
    local_118 = (mtree_entry *)0x0;
LAB_0040831e:
    __s = __archive_read_ahead(local_128,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) {
      uVar24 = 0;
      paVar13 = local_120;
    }
    else {
      uVar23 = 0;
      lVar27 = 0;
      do {
        uVar24 = 0xffffffffffffffe2;
        paVar13 = local_120;
        if ((long)local_c0.st_dev < 0) goto LAB_004084a3;
        pvVar12 = memchr(__s,10,local_c0.st_dev);
        if (pvVar12 != (void *)0x0) {
          local_c0.st_dev = (long)pvVar12 + (1 - (long)__s);
        }
        if (0xffff < (long)(local_c0.st_dev + uVar23)) {
          iVar4 = 0x54;
          pcVar11 = "Line too long";
LAB_00408486:
          archive_set_error(&local_128->archive,iVar4,pcVar11);
          paVar13 = local_120;
          goto LAB_004084a3;
        }
        paVar13 = archive_string_ensure(&mtree->line,local_c0.st_dev + uVar23 + 1);
        if (paVar13 == (archive_string *)0x0) {
          iVar4 = 0xc;
          pcVar11 = "Can\'t allocate working buffer";
          goto LAB_00408486;
        }
        memcpy((mtree->line).s + uVar23,__s,local_c0.st_dev);
        __archive_read_consume(local_128,local_c0.st_dev);
        uVar23 = uVar23 + local_c0.st_dev;
        (mtree->line).s[uVar23] = '\0';
        paVar13 = (archive_string *)(mtree->line).s;
        pbVar26 = (byte *)((long)paVar13 + lVar27);
LAB_004083e2:
        bVar1 = *pbVar26;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar12 == (void *)0x0) goto LAB_00408426;
          }
          else {
            if (bVar1 == 0) goto LAB_00408426;
            uVar24 = uVar23;
            if (bVar1 == 10) goto LAB_004084a3;
          }
LAB_00408418:
          pbVar26 = pbVar26 + 1;
          goto LAB_004083e2;
        }
        if ((bVar1 != 0x5c) || (pbVar26[1] == 0)) goto LAB_00408418;
        if (pbVar26[1] != 10) {
          pbVar26 = pbVar26 + 1;
          goto LAB_00408418;
        }
        *(char *)((long)paVar13 + (uVar23 - 2)) = '\0';
        uVar23 = uVar23 - 2;
LAB_00408426:
        lVar27 = (long)pbVar26 - (long)(mtree->line).s;
        __s = __archive_read_ahead(local_128,1,(ssize_t *)&local_c0);
      } while (__s != (void *)0x0);
      uVar24 = 0;
      paVar13 = local_120;
    }
LAB_004084a3:
    uVar3 = (uint32_t)local_e0;
    if (uVar24 == 0) {
      mtree->this_entry = mtree->entries;
      free_options((mtree_option *)local_130);
      iVar4 = 0;
      goto LAB_00408a03;
    }
    if (-1 < (long)uVar24) {
      lVar27 = 0;
      pcVar11 = (char *)paVar13;
      while( true ) {
        pcVar11 = pcVar11 + 1;
        uVar23 = (ulong)*(byte *)((long)paVar13 + lVar27);
        if (0x2f < uVar23) break;
        if ((0x100000200U >> (uVar23 & 0x3f) & 1) == 0) {
          if ((0x800002401U >> (uVar23 & 0x3f) & 1) != 0) goto LAB_004088ef;
          if (uVar23 == 0x2f) {
            if (((long)(uVar24 - lVar27) < 5) ||
               (iVar4 = strncmp((char *)((long)paVar13 + lVar27),"/set",4), iVar4 != 0)) {
              if (((6 < (long)(uVar24 - lVar27)) &&
                  (iVar4 = strncmp((char *)((long)paVar13 + lVar27),"/unset",6), iVar4 == 0)) &&
                 ((*(char *)((long)paVar13 + lVar27 + 6) == ' ' ||
                  (*(char *)((long)paVar13 + lVar27 + 6) == '\t')))) {
                pcVar11 = strchr((char *)((long)paVar13 + lVar27 + 6),0x3d);
                if (pcVar11 == (char *)0x0) {
                  sVar16 = strspn((char *)((long)paVar13 + lVar27 + 6)," \t\r\n");
                  uVar24 = 0;
                  if (*(char *)((long)paVar13 + lVar27 + 6 + sVar16) != '\0') {
                    pcVar11 = (char *)((long)paVar13 + lVar27 + sVar16 + 6);
                    local_120 = paVar13;
                    do {
                      sVar16 = strcspn(pcVar11," \t\r\n");
                      if ((sVar16 == 3) && (iVar4 = strncmp(pcVar11,"all",3), iVar4 == 0)) {
                        free_options((mtree_option *)local_130);
                        local_130 = (archive_entry *)0x0;
                      }
                      else {
                        remove_option((mtree_option **)&local_130,pcVar11,sVar16);
                      }
                      pcVar19 = pcVar11 + sVar16;
                      sVar16 = strspn(pcVar19," \t\r\n");
                      pcVar11 = pcVar19 + sVar16;
                      paVar13 = local_120;
                    } while (pcVar19[sVar16] != '\0');
                  }
                }
                else {
                  archive_set_error(&local_128->archive,-1,"/unset shall not contain `=\'");
                  uVar24 = 0xffffffe2;
                }
                goto LAB_004088e6;
              }
            }
            else if ((*(char *)((long)paVar13 + lVar27 + 4) == ' ') ||
                    (*(char *)((long)paVar13 + lVar27 + 4) == '\t')) {
              pcVar11 = (char *)((long)paVar13 + lVar27 + 4);
              local_120 = paVar13;
              goto LAB_00408922;
            }
            archive_set_error(&local_128->archive,0x54,"Can\'t parse line %ju",local_e8);
            free_options((mtree_option *)local_130);
            iVar4 = -0x1e;
            goto LAB_00408a03;
          }
          break;
        }
        lVar27 = lVar27 + 1;
      }
      pmVar8 = (mtree_entry *)malloc(0x40);
      if (pmVar8 != (mtree_entry *)0x0) {
        pcVar19 = (char *)((long)paVar13 + lVar27);
        lVar25 = uVar24 - lVar27;
        *(undefined8 *)((long)&pmVar8->options + 2) = 0;
        *(undefined8 *)((long)&pmVar8->name + 2) = 0;
        pmVar8->next = (mtree_entry *)0x0;
        pmVar8->options = (mtree_option *)0x0;
        ppmVar14 = &local_118->next;
        if (local_118 == (mtree_entry *)0x0) {
          ppmVar14 = local_d8;
        }
        *ppmVar14 = pmVar8;
        local_108 = pmVar8;
        local_100 = pmVar8;
        if (uVar3 == 0) {
          local_120 = paVar13;
          pcVar21 = (char *)strcspn(pcVar19," \t\r\n");
          pcVar11 = pcVar21 + (long)pcVar19;
          local_118 = (mtree_entry *)(pcVar11 + lVar25);
          local_f0 = pcVar19;
        }
        else {
          do {
            if (lVar25 < 1) break;
            bVar2 = false;
            if (((ulong)*(byte *)((long)paVar13 + lVar27 + -1 + lVar25) < 0x21) &&
               ((0x100002600U >> ((ulong)*(byte *)((long)paVar13 + lVar27 + -1 + lVar25) & 0x3f) & 1
                ) != 0)) {
              lVar25 = lVar25 + -1;
              bVar2 = true;
            }
          } while (bVar2);
          lVar15 = lVar25;
          local_118 = (mtree_entry *)pcVar19;
          if (0 < lVar25) {
            do {
              if (((ulong)(byte)pcVar11[-1] < 0x21) &&
                 ((0x100002600U >> ((ulong)(byte)pcVar11[-1] & 0x3f) & 1) != 0)) {
                local_118 = (mtree_entry *)pcVar11;
              }
              pcVar11 = pcVar11 + 1;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          pcVar21 = pcVar19 + (lVar25 - (long)local_118);
          pcVar11 = pcVar19;
          local_120 = paVar13;
          local_f0 = (char *)local_118;
        }
        pcVar19 = (char *)malloc((size_t)(pcVar21 + 1));
        local_108->name = pcVar19;
        if (pcVar19 != (char *)0x0) {
          memcpy(pcVar19,local_f0,(size_t)pcVar21);
          pmVar8 = local_108;
          pcVar19[(long)pcVar21] = '\0';
          parse_escapes(pcVar19,local_108);
          pmVar8->next_dup = (mtree_entry *)0x0;
          if ((pmVar8->full != '\0') &&
             (iVar4 = __archive_rb_tree_insert_node(local_f8,&pmVar8->rbnode), iVar4 == 0)) {
            paVar17 = __archive_rb_tree_find_node(local_f8,pmVar8->name);
            do {
              paVar18 = paVar17;
              paVar17 = paVar18[1].rb_nodes[0];
            } while (paVar17 != (archive_rb_node *)0x0);
            paVar18[1].rb_nodes[0] = &pmVar8->rbnode;
          }
          local_100 = (mtree_entry *)&local_100->options;
          puVar28 = (undefined1 *)&local_130;
          do {
            puVar28 = *(undefined1 **)puVar28;
            if (puVar28 == (undefined1 *)0x0) goto LAB_0040884f;
            pcVar19 = *(char **)((long)puVar28 + 8);
            sVar16 = strlen(pcVar19);
            uVar7 = add_option(local_128,(mtree_option **)local_100,pcVar19,sVar16);
          } while (uVar7 == 0);
          uVar24 = (ulong)uVar7;
          local_118 = local_108;
          paVar13 = local_120;
          goto LAB_004088e6;
        }
        piVar9 = __errno_location();
        archive_set_error(&local_128->archive,*piVar9,"Can\'t allocate memory");
        uVar24 = 0xffffffe2;
        goto LAB_004088d7;
      }
      piVar9 = __errno_location();
      archive_set_error(&local_128->archive,*piVar9,"Can\'t allocate memory");
      uVar24 = 0xffffffe2;
      goto LAB_004088e6;
    }
LAB_004089b3:
    iVar4 = (int)uVar24;
    free_options((mtree_option *)local_130);
LAB_00408a03:
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  (local_128->archive).archive_format = mtree->archive_format;
  (local_128->archive).archive_format_name = mtree->archive_format_name;
  pmVar8 = mtree->this_entry;
  if (pmVar8 != (mtree_entry *)0x0) {
    local_100 = (mtree_entry *)&mtree->rbtree;
    paVar13 = &mtree->current_dir;
    local_120 = paVar13;
    do {
      iVar4 = strcmp(pmVar8->name,"..");
      if (iVar4 == 0) {
        pmVar8->used = '\x01';
        sVar20 = (mtree->current_dir).length;
        if (sVar20 != 0) {
          pcVar11 = (mtree->current_dir).s;
          pcVar19 = pcVar11 + sVar20;
          do {
            pcVar21 = pcVar19;
            pcVar19 = pcVar21 + -1;
            if (pcVar19 < pcVar11) break;
          } while (*pcVar19 != '/');
          pcVar21 = pcVar21 + -2;
          if (pcVar19 < pcVar11) {
            pcVar21 = pcVar19;
          }
          (mtree->current_dir).length = (size_t)(pcVar21 + (1 - (long)pcVar11));
        }
      }
      if (pmVar8->used == '\0') {
        local_130 = local_c8;
        pmVar8->used = '\x01';
        archive_entry_set_filetype(local_c8,0x8000);
        archive_entry_set_size(local_130,0);
        (mtree->contents_name).length = 0;
        local_10c = 0;
        iVar4 = parse_line(local_128,local_130,mtree,pmVar8,(int *)&local_10c);
        if (pmVar8->full == '\0') {
          sVar20 = (mtree->current_dir).length;
          if (sVar20 != 0) {
            archive_strcat(paVar13,"/");
          }
          archive_strcat(paVar13,pmVar8->name);
          archive_entry_copy_pathname(local_130,paVar13->s);
          mVar6 = archive_entry_filetype(local_130);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar20;
          }
        }
        else {
          archive_entry_copy_pathname(local_130,pmVar8->name);
          for (pmVar8 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)local_100,pmVar8->name);
              pmVar8 != (mtree_entry *)0x0; pmVar8 = pmVar8->next_dup) {
            if ((pmVar8->full != '\0') && (pmVar8->used == '\0')) {
              pmVar8->used = '\x01';
              iVar5 = parse_line(local_128,local_130,mtree,pmVar8,(int *)&local_10c);
              if (iVar5 < iVar4) {
                iVar4 = iVar5;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_004081e9:
          lVar10 = archive_entry_size(local_130);
          mtree->cur_size = lVar10;
          mtree->offset = 0;
          bVar2 = true;
          iVar5 = iVar4;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar11 = archive_entry_pathname(local_130);
          }
          else {
            pcVar11 = (mtree->contents_name).s;
          }
          __buf = &local_c0;
          mVar6 = archive_entry_filetype(local_130);
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x4000)) {
            iVar5 = open(pcVar11,0x80000);
            mtree->fd = iVar5;
            __archive_ensure_cloexec_flag(iVar5);
            if (mtree->fd == -1) {
              piVar9 = __errno_location();
              if ((*piVar9 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&local_128->archive,*piVar9,"Can\'t open %s",pcVar11);
                iVar4 = -0x14;
              }
            }
          }
          if (mtree->fd < 0) {
            iVar5 = lstat(pcVar11,__buf);
            if (iVar5 == -1) goto LAB_00407f9c;
            ptVar22 = &local_c0.st_mtim;
          }
          else {
            iVar5 = fstat(mtree->fd,__buf);
            ptVar22 = &local_c0.st_mtim;
            if (iVar5 == -1) {
              piVar9 = __errno_location();
              archive_set_error(&local_128->archive,*piVar9,"Could not fstat %s",pcVar11);
              close(mtree->fd);
              mtree->fd = -1;
              iVar4 = -0x14;
LAB_00407f9c:
              ptVar22 = (timespec *)0x58;
              __buf = (stat *)0x0;
            }
          }
          if (__buf == (stat *)0x0) {
            bVar2 = false;
            iVar5 = 0;
            if ((local_10c & 0x800) == 0) goto LAB_004081e9;
          }
          else {
            if (((((((__buf->st_mode & 0xf000) == 0x8000) &&
                   (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x8000)) ||
                  (((__buf->st_mode & 0xf000) == 0xa000 &&
                   (mVar6 = archive_entry_filetype(local_130), mVar6 == 0xa000)))) ||
                 ((((~__buf->st_mode & 0xc000) == 0 &&
                   (mVar6 = archive_entry_filetype(local_130), mVar6 == 0xc000)) ||
                  (((__buf->st_mode & 0xf000) == 0x2000 &&
                   (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x2000)))))) ||
                ((((__buf->st_mode & 0xf000) == 0x6000 &&
                  (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x6000)) ||
                 (((__buf->st_mode & 0xf000) == 0x4000 &&
                  (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x4000)))))) ||
               (((__buf->st_mode & 0xf000) == 0x1000 &&
                (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x1000)))) {
              uVar7 = local_10c;
              if (((local_10c & 0x1001) != 1) &&
                 ((mVar6 = archive_entry_filetype(local_130), mVar6 == 0x2000 ||
                  (mVar6 = archive_entry_filetype(local_130), mVar6 == 0x6000)))) {
                archive_entry_set_rdev(local_130,__buf->st_rdev);
              }
              if ((uVar7 & 0xc) == 0 || (uVar7 >> 0xc & 1) != 0) {
                archive_entry_set_gid(local_130,(ulong)__buf->st_gid);
              }
              if ((uVar7 & 0x600) == 0 || (uVar7 >> 0xc & 1) != 0) {
                archive_entry_set_uid(local_130,(ulong)__buf->st_uid);
              }
              if ((uVar7 & 0x1010) != 0x10) {
                archive_entry_set_mtime(local_130,(__buf->st_mtim).tv_sec,ptVar22->tv_nsec);
              }
              if ((uVar7 & 0x1020) != 0x20) {
                archive_entry_set_nlink(local_130,(uint)__buf->st_nlink);
              }
              if ((uVar7 & 0x1040) != 0x40) {
                archive_entry_set_perm(local_130,__buf->st_mode);
              }
              if ((uVar7 & 0x1080) != 0x80) {
                archive_entry_set_size(local_130,__buf->st_size);
              }
              archive_entry_set_ino(local_130,__buf->st_ino);
              archive_entry_set_dev(local_130,__buf->st_dev);
              archive_entry_linkify(mtree->resolver,&local_130,&local_e0);
              goto LAB_004081e9;
            }
            if (-1 < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = -1;
            iVar5 = iVar4;
            if ((local_10c & 0x800) == 0) {
              bVar2 = true;
              if (iVar4 == 0) {
                pcVar11 = archive_entry_pathname(local_130);
                archive_set_error(&local_128->archive,-1,
                                  "mtree specification has different type for %s",pcVar11);
                iVar5 = -0x14;
                bVar2 = true;
              }
            }
            else {
              bVar2 = false;
            }
          }
        }
        paVar13 = local_120;
        if (bVar2) {
          return iVar5;
        }
      }
      pmVar8 = mtree->this_entry->next;
      mtree->this_entry = pmVar8;
    } while (pmVar8 != (mtree_entry *)0x0);
  }
  return 1;
  while( true ) {
    pcVar21 = pcVar11 + sVar16;
    sVar16 = strcspn(pcVar21," \t\r\n");
    pcVar11 = pcVar21 + sVar16;
    pcVar19 = strchr(pcVar21,0x3d);
    sVar20 = (long)pcVar19 - (long)pcVar21;
    if (pcVar11 < pcVar19) {
      sVar20 = sVar16;
    }
    remove_option((mtree_option **)&local_130,pcVar21,sVar20);
    paVar13 = local_120;
    uVar7 = add_option(local_128,(mtree_option **)&local_130,pcVar21,sVar16);
    if (uVar7 != 0) break;
LAB_00408922:
    sVar16 = strspn(pcVar11," \t\r\n");
    if (pcVar11[sVar16] == '\0') {
      uVar24 = 0;
      goto LAB_004088e6;
    }
  }
  uVar24 = (ulong)uVar7;
  goto LAB_004088e6;
  while( true ) {
    len = strcspn(pcVar19," \t\r\n");
    pcVar11 = pcVar19 + len;
    pcVar21 = strchr(pcVar19,0x3d);
    pmVar8 = local_100;
    sVar16 = (long)pcVar21 - (long)pcVar19;
    if (pcVar11 < pcVar21) {
      sVar16 = len;
    }
    if (pcVar21 == (char *)0x0) {
      sVar16 = len;
    }
    remove_option((mtree_option **)local_100,pcVar19,sVar16);
    uVar7 = add_option(local_128,(mtree_option **)pmVar8,pcVar19,len);
    mtree = local_d0;
    if (uVar7 != 0) break;
LAB_0040884f:
    local_d0 = mtree;
    mtree = local_d0;
    sVar16 = strspn(pcVar11," \t\r\n");
    uVar24 = 0;
    if ((pcVar11[sVar16] == '\0') || (pcVar19 = pcVar11 + sVar16, local_118 <= pcVar19))
    goto LAB_004088d7;
  }
  uVar24 = (ulong)uVar7;
LAB_004088d7:
  local_118 = local_108;
  paVar13 = local_120;
LAB_004088e6:
  if ((int)uVar24 != 0) goto LAB_004089b3;
LAB_004088ef:
  local_e8 = local_e8 + 1;
  local_120 = (archive_string *)((long)paVar13 + lVar27);
  goto LAB_0040831e;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}